

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<4,_4,_257,_true,_embree::avx2::VirtualCurveIntersectorK<4>,_true>::
     intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
               RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 (*pauVar7) [16];
  uint uVar8;
  undefined4 uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  undefined1 (*pauVar14) [16];
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  undefined1 auVar19 [64];
  vint4 ai;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  vint4 ai_3;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  vint4 ai_1;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  vint4 bi_1;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  vint4 bi_3;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  vint4 bi;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [64];
  undefined1 auVar40 [16];
  undefined1 auVar41 [64];
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar52;
  float fVar53;
  float fVar54;
  undefined1 auVar51 [16];
  float fVar55;
  float fVar57;
  float fVar58;
  float fVar59;
  undefined1 auVar56 [16];
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  undefined1 auVar64 [16];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_10c8 [16];
  undefined1 local_10b8 [16];
  ulong local_10a0;
  Intersectors *local_1098;
  size_t local_1090;
  Precalculations *local_1088;
  RayHitK<4> *local_1080;
  float local_1078;
  float fStack_1074;
  float fStack_1070;
  float fStack_106c;
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  undefined1 local_1028 [16];
  undefined1 local_1018 [16];
  undefined1 local_1008 [16];
  undefined1 local_ff8 [16];
  undefined1 local_fe8 [16];
  undefined1 local_fd8 [16];
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  undefined4 local_fb8;
  undefined4 uStack_fb4;
  undefined4 uStack_fb0;
  undefined4 uStack_fac;
  undefined4 local_fa8;
  undefined4 uStack_fa4;
  undefined4 uStack_fa0;
  undefined4 uStack_f9c;
  undefined1 local_f98 [16];
  undefined1 local_f88 [16];
  size_t local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  local_1088 = pre;
  local_1098 = This;
  pauVar14 = (undefined1 (*) [16])local_f68;
  local_f78 = root.ptr;
  uStack_f70 = 0;
  uVar9 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_f88._4_4_ = uVar9;
  local_f88._0_4_ = uVar9;
  local_f88._8_4_ = uVar9;
  local_f88._12_4_ = uVar9;
  auVar66 = ZEXT1664(local_f88);
  uVar9 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_f98._4_4_ = uVar9;
  local_f98._0_4_ = uVar9;
  local_f98._8_4_ = uVar9;
  local_f98._12_4_ = uVar9;
  auVar67 = ZEXT1664(local_f98);
  uVar9 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_1018._4_4_ = uVar9;
  local_1018._0_4_ = uVar9;
  local_1018._8_4_ = uVar9;
  local_1018._12_4_ = uVar9;
  auVar65 = ZEXT1664(local_1018);
  local_fa8 = *(undefined4 *)((long)&(tray->dir).field_0 + k * 4);
  uStack_fa4 = local_fa8;
  uStack_fa0 = local_fa8;
  uStack_f9c = local_fa8;
  local_fb8 = *(undefined4 *)((long)&(tray->dir).field_0 + k * 4 + 0x10);
  uStack_fb4 = local_fb8;
  uStack_fb0 = local_fb8;
  uStack_fac = local_fb8;
  local_fc8 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x20);
  fStack_fc4 = local_fc8;
  fStack_fc0 = local_fc8;
  fStack_fbc = local_fc8;
  fVar50 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar55 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar60 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar42 = fVar50 * 0.99999964;
  local_1028._4_4_ = fVar42;
  local_1028._0_4_ = fVar42;
  local_1028._8_4_ = fVar42;
  local_1028._12_4_ = fVar42;
  auVar41 = ZEXT1664(local_1028);
  fVar42 = fVar55 * 0.99999964;
  fVar46 = fVar60 * 0.99999964;
  fVar50 = fVar50 * 1.0000004;
  fVar55 = fVar55 * 1.0000004;
  fVar60 = fVar60 * 1.0000004;
  uVar16 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar18 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar13 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar17 = uVar16 ^ 0x10;
  iVar1 = (tray->tnear).field_0.i[k];
  local_10b8._4_4_ = iVar1;
  local_10b8._0_4_ = iVar1;
  local_10b8._8_4_ = iVar1;
  local_10b8._12_4_ = iVar1;
  auVar39 = ZEXT1664(local_10b8);
  iVar1 = (tray->tfar).field_0.i[k];
  auVar19 = ZEXT1664(CONCAT412(iVar1,CONCAT48(iVar1,CONCAT44(iVar1,iVar1))));
  local_1080 = ray;
  local_1090 = k;
  local_1038 = fVar42;
  fStack_1034 = fVar42;
  fStack_1030 = fVar42;
  fStack_102c = fVar42;
  local_1048 = fVar46;
  fStack_1044 = fVar46;
  fStack_1040 = fVar46;
  fStack_103c = fVar46;
  local_1058 = fVar50;
  fStack_1054 = fVar50;
  fStack_1050 = fVar50;
  fStack_104c = fVar50;
  local_1068 = fVar55;
  fStack_1064 = fVar55;
  fStack_1060 = fVar55;
  fStack_105c = fVar55;
  local_1078 = fVar60;
  fStack_1074 = fVar60;
  fStack_1070 = fVar60;
  fStack_106c = fVar60;
  local_10a0 = uVar16;
  fVar43 = fVar42;
  fVar44 = fVar42;
  fVar45 = fVar42;
  fVar47 = fVar46;
  fVar48 = fVar46;
  fVar49 = fVar46;
  fVar52 = fVar50;
  fVar53 = fVar50;
  fVar54 = fVar50;
  fVar57 = fVar55;
  fVar58 = fVar55;
  fVar59 = fVar55;
  fVar61 = fVar60;
  fVar62 = fVar60;
  fVar63 = fVar60;
  while (pauVar7 = pauVar14 + -1, pauVar14 = pauVar14 + -1,
        *(float *)(ray + k * 4 + 0x80) < *(float *)(*pauVar7 + 8)) {
LAB_0052394e:
    if (pauVar14 == (undefined1 (*) [16])&local_f78) {
      return;
    }
  }
  uVar11 = *(ulong *)*pauVar14;
LAB_005233fb:
  auVar23 = auVar66._0_16_;
  auVar32 = auVar67._0_16_;
  if ((uVar11 & 0xf) == 0) {
    auVar22 = vsubps_avx(*(undefined1 (*) [16])(uVar11 + 0x20 + uVar16),auVar23);
    auVar20._0_4_ = auVar41._0_4_ * auVar22._0_4_;
    auVar20._4_4_ = auVar41._4_4_ * auVar22._4_4_;
    auVar20._8_4_ = auVar41._8_4_ * auVar22._8_4_;
    auVar20._12_4_ = auVar41._12_4_ * auVar22._12_4_;
    auVar22 = vsubps_avx(*(undefined1 (*) [16])(uVar11 + 0x20 + uVar18),auVar32);
    auVar25._0_4_ = fVar42 * auVar22._0_4_;
    auVar25._4_4_ = fVar43 * auVar22._4_4_;
    auVar25._8_4_ = fVar44 * auVar22._8_4_;
    auVar25._12_4_ = fVar45 * auVar22._12_4_;
    auVar22 = vmaxps_avx(auVar20,auVar25);
    auVar34 = vsubps_avx(*(undefined1 (*) [16])(uVar11 + 0x20 + uVar13),auVar65._0_16_);
    auVar26._0_4_ = fVar46 * auVar34._0_4_;
    auVar26._4_4_ = fVar47 * auVar34._4_4_;
    auVar26._8_4_ = fVar48 * auVar34._8_4_;
    auVar26._12_4_ = fVar49 * auVar34._12_4_;
    auVar23 = vsubps_avx(*(undefined1 (*) [16])(uVar11 + 0x20 + uVar17),auVar23);
    auVar29._0_4_ = fVar50 * auVar23._0_4_;
    auVar29._4_4_ = fVar52 * auVar23._4_4_;
    auVar29._8_4_ = fVar53 * auVar23._8_4_;
    auVar29._12_4_ = fVar54 * auVar23._12_4_;
    auVar23 = vsubps_avx(*(undefined1 (*) [16])(uVar11 + 0x20 + (uVar18 ^ 0x10)),auVar32);
    auVar32._0_4_ = fVar55 * auVar23._0_4_;
    auVar32._4_4_ = fVar57 * auVar23._4_4_;
    auVar32._8_4_ = fVar58 * auVar23._8_4_;
    auVar32._12_4_ = fVar59 * auVar23._12_4_;
    auVar32 = vminps_avx(auVar29,auVar32);
    auVar23 = vsubps_avx(*(undefined1 (*) [16])(uVar11 + 0x20 + (uVar13 ^ 0x10)),auVar65._0_16_);
    auVar33._0_4_ = fVar60 * auVar23._0_4_;
    auVar33._4_4_ = fVar61 * auVar23._4_4_;
    auVar33._8_4_ = fVar62 * auVar23._8_4_;
    auVar33._12_4_ = fVar63 * auVar23._12_4_;
    auVar23 = vmaxps_avx(auVar26,auVar39._0_16_);
    local_10c8 = vmaxps_avx(auVar22,auVar23);
    auVar23 = vminps_avx(auVar33,auVar19._0_16_);
    auVar23 = vminps_avx(auVar32,auVar23);
    auVar23 = vcmpps_avx(local_10c8,auVar23,2);
    uVar8 = vmovmskps_avx(auVar23);
    uVar10 = (ulong)uVar8;
  }
  else {
    if ((int)(uVar11 & 0xf) != 2) {
      (**(code **)((long)local_1098->leafIntersector +
                  (ulong)*(byte *)(uVar11 & 0xfffffffffffffff0) * 0x40 + 0x10))
                (local_1088,ray,k,context);
      auVar67 = ZEXT1664(local_f98);
      auVar66 = ZEXT1664(local_f88);
      uVar9 = *(undefined4 *)(local_1080 + local_1090 * 4 + 0x80);
      auVar19 = ZEXT1664(CONCAT412(uVar9,CONCAT48(uVar9,CONCAT44(uVar9,uVar9))));
      auVar65 = ZEXT1664(local_1018);
      auVar41 = ZEXT1664(local_1028);
      auVar39 = ZEXT1664(local_10b8);
      ray = local_1080;
      k = local_1090;
      uVar16 = local_10a0;
      fVar42 = local_1038;
      fVar43 = fStack_1034;
      fVar44 = fStack_1030;
      fVar45 = fStack_102c;
      fVar46 = local_1048;
      fVar47 = fStack_1044;
      fVar48 = fStack_1040;
      fVar49 = fStack_103c;
      fVar50 = local_1058;
      fVar52 = fStack_1054;
      fVar53 = fStack_1050;
      fVar54 = fStack_104c;
      fVar55 = local_1068;
      fVar57 = fStack_1064;
      fVar58 = fStack_1060;
      fVar59 = fStack_105c;
      fVar60 = local_1078;
      fVar61 = fStack_1074;
      fVar62 = fStack_1070;
      fVar63 = fStack_106c;
      goto LAB_0052394e;
    }
    uVar10 = uVar11 & 0xfffffffffffffff0;
    auVar22 = *(undefined1 (*) [16])(uVar10 + 0x80);
    auVar40._0_4_ = local_fc8 * auVar22._0_4_;
    auVar40._4_4_ = fStack_fc4 * auVar22._4_4_;
    auVar40._8_4_ = fStack_fc0 * auVar22._8_4_;
    auVar40._12_4_ = fStack_fbc * auVar22._12_4_;
    auVar34 = *(undefined1 (*) [16])(uVar10 + 0x90);
    auVar51._0_4_ = local_fc8 * auVar34._0_4_;
    auVar51._4_4_ = fStack_fc4 * auVar34._4_4_;
    auVar51._8_4_ = fStack_fc0 * auVar34._8_4_;
    auVar51._12_4_ = fStack_fbc * auVar34._12_4_;
    auVar20 = *(undefined1 (*) [16])(uVar10 + 0xa0);
    auVar56._0_4_ = local_fc8 * auVar20._0_4_;
    auVar56._4_4_ = fStack_fc4 * auVar20._4_4_;
    auVar56._8_4_ = fStack_fc0 * auVar20._8_4_;
    auVar56._12_4_ = fStack_fbc * auVar20._12_4_;
    local_fe8 = *(undefined1 (*) [16])(uVar10 + 0x20);
    local_fd8 = *(undefined1 (*) [16])(uVar10 + 0x30);
    local_1008 = *(undefined1 (*) [16])(uVar10 + 0x40);
    local_ff8 = *(undefined1 (*) [16])(uVar10 + 0x50);
    auVar5._4_4_ = uStack_fb4;
    auVar5._0_4_ = local_fb8;
    auVar5._8_4_ = uStack_fb0;
    auVar5._12_4_ = uStack_fac;
    auVar40 = vfmadd231ps_fma(auVar40,auVar5,local_ff8);
    auVar27 = vfmadd231ps_fma(auVar51,auVar5,*(undefined1 (*) [16])(uVar10 + 0x60));
    auVar6._4_4_ = uStack_fa4;
    auVar6._0_4_ = local_fa8;
    auVar6._8_4_ = uStack_fa0;
    auVar6._12_4_ = uStack_f9c;
    auVar38 = vfmadd231ps_fma(auVar40,auVar6,local_fe8);
    auVar35 = vfmadd231ps_fma(auVar27,auVar6,local_fd8);
    auVar64._8_4_ = 0x7fffffff;
    auVar64._0_8_ = 0x7fffffff7fffffff;
    auVar64._12_4_ = 0x7fffffff;
    auVar40 = vandps_avx(auVar64,auVar38);
    auVar37._8_4_ = 0x219392ef;
    auVar37._0_8_ = 0x219392ef219392ef;
    auVar37._12_4_ = 0x219392ef;
    auVar40 = vcmpps_avx(auVar40,auVar37,1);
    auVar27 = vblendvps_avx(auVar38,auVar37,auVar40);
    auVar40 = vandps_avx(auVar35,auVar64);
    auVar40 = vcmpps_avx(auVar40,auVar37,1);
    auVar38 = vblendvps_avx(auVar35,auVar37,auVar40);
    auVar40 = vfmadd231ps_fma(auVar56,auVar5,*(undefined1 (*) [16])(uVar10 + 0x70));
    auVar35 = vfmadd231ps_fma(auVar40,auVar6,local_1008);
    auVar40 = vandps_avx(auVar35,auVar64);
    auVar40 = vcmpps_avx(auVar40,auVar37,1);
    auVar40 = vblendvps_avx(auVar35,auVar37,auVar40);
    auVar35 = vrcpps_avx(auVar27);
    auVar21._8_4_ = 0x3f800000;
    auVar21._0_8_ = 0x3f8000003f800000;
    auVar21._12_4_ = 0x3f800000;
    auVar27 = vfnmadd213ps_fma(auVar27,auVar35,auVar21);
    auVar35 = vfmadd132ps_fma(auVar27,auVar35,auVar35);
    auVar27 = vrcpps_avx(auVar38);
    auVar38 = vfnmadd213ps_fma(auVar38,auVar27,auVar21);
    auVar38 = vfmadd132ps_fma(auVar38,auVar27,auVar27);
    auVar27 = vrcpps_avx(auVar40);
    auVar40 = vfnmadd213ps_fma(auVar40,auVar27,auVar21);
    auVar40 = vfmadd132ps_fma(auVar40,auVar27,auVar27);
    auVar65 = ZEXT1664(local_1018);
    auVar22 = vfmadd213ps_fma(auVar22,local_1018,*(undefined1 (*) [16])(uVar10 + 0xb0));
    auVar34 = vfmadd213ps_fma(auVar34,local_1018,*(undefined1 (*) [16])(uVar10 + 0xc0));
    auVar27 = vfmadd231ps_fma(auVar22,auVar32,local_ff8);
    auVar34 = vfmadd231ps_fma(auVar34,auVar32,*(undefined1 (*) [16])(uVar10 + 0x60));
    auVar22 = vfmadd213ps_fma(auVar20,local_1018,*(undefined1 (*) [16])(uVar10 + 0xd0));
    auVar32 = vfmadd231ps_fma(auVar22,auVar32,*(undefined1 (*) [16])(uVar10 + 0x70));
    auVar22 = vfmadd231ps_fma(auVar27,auVar23,local_fe8);
    auVar30._0_4_ = auVar22._0_4_ * -auVar35._0_4_;
    auVar30._4_4_ = auVar22._4_4_ * -auVar35._4_4_;
    auVar30._8_4_ = auVar22._8_4_ * -auVar35._8_4_;
    auVar30._12_4_ = auVar22._12_4_ * -auVar35._12_4_;
    auVar22 = vfmadd231ps_fma(auVar34,auVar23,local_fd8);
    auVar27._0_4_ = auVar22._0_4_ * -auVar38._0_4_;
    auVar27._4_4_ = auVar22._4_4_ * -auVar38._4_4_;
    auVar27._8_4_ = auVar22._8_4_ * -auVar38._8_4_;
    auVar27._12_4_ = auVar22._12_4_ * -auVar38._12_4_;
    auVar23 = vfmadd231ps_fma(auVar32,auVar23,local_1008);
    auVar22._0_4_ = auVar23._0_4_ * -auVar40._0_4_;
    auVar22._4_4_ = auVar23._4_4_ * -auVar40._4_4_;
    auVar22._8_4_ = auVar23._8_4_ * -auVar40._8_4_;
    auVar22._12_4_ = auVar23._12_4_ * -auVar40._12_4_;
    auVar34._0_4_ = auVar35._0_4_ + auVar30._0_4_;
    auVar34._4_4_ = auVar35._4_4_ + auVar30._4_4_;
    auVar34._8_4_ = auVar35._8_4_ + auVar30._8_4_;
    auVar34._12_4_ = auVar35._12_4_ + auVar30._12_4_;
    auVar35._0_4_ = auVar38._0_4_ + auVar27._0_4_;
    auVar35._4_4_ = auVar38._4_4_ + auVar27._4_4_;
    auVar35._8_4_ = auVar38._8_4_ + auVar27._8_4_;
    auVar35._12_4_ = auVar38._12_4_ + auVar27._12_4_;
    auVar38._0_4_ = auVar40._0_4_ + auVar22._0_4_;
    auVar38._4_4_ = auVar40._4_4_ + auVar22._4_4_;
    auVar38._8_4_ = auVar40._8_4_ + auVar22._8_4_;
    auVar38._12_4_ = auVar40._12_4_ + auVar22._12_4_;
    auVar23 = vpminsd_avx(auVar27,auVar35);
    auVar32 = vpminsd_avx(auVar22,auVar38);
    auVar23 = vmaxps_avx(auVar23,auVar32);
    auVar20 = vpminsd_avx(auVar30,auVar34);
    auVar34 = vpmaxsd_avx(auVar30,auVar34);
    auVar32 = vpmaxsd_avx(auVar27,auVar35);
    auVar22 = vpmaxsd_avx(auVar22,auVar38);
    auVar22 = vminps_avx(auVar32,auVar22);
    auVar39 = ZEXT1664(local_10b8);
    auVar32 = vmaxps_avx(local_10b8,auVar20);
    auVar23 = vmaxps_avx(auVar32,auVar23);
    auVar32 = vminps_avx(auVar19._0_16_,auVar34);
    auVar32 = vminps_avx(auVar32,auVar22);
    local_10c8._0_4_ = auVar23._0_4_ * 0.99999964;
    local_10c8._4_4_ = auVar23._4_4_ * 0.99999964;
    local_10c8._8_4_ = auVar23._8_4_ * 0.99999964;
    local_10c8._12_4_ = auVar23._12_4_ * 0.99999964;
    auVar23._0_4_ = auVar32._0_4_ * 1.0000004;
    auVar23._4_4_ = auVar32._4_4_ * 1.0000004;
    auVar23._8_4_ = auVar32._8_4_ * 1.0000004;
    auVar23._12_4_ = auVar32._12_4_ * 1.0000004;
    auVar23 = vcmpps_avx(local_10c8,auVar23,2);
    uVar9 = vmovmskps_avx(auVar23);
    uVar10 = CONCAT44((int)(uVar10 >> 0x20),uVar9);
    auVar41 = ZEXT1664(local_1028);
    fVar42 = local_1038;
    fVar43 = fStack_1034;
    fVar44 = fStack_1030;
    fVar45 = fStack_102c;
    fVar46 = local_1048;
    fVar47 = fStack_1044;
    fVar48 = fStack_1040;
    fVar49 = fStack_103c;
    fVar50 = local_1058;
    fVar52 = fStack_1054;
    fVar53 = fStack_1050;
    fVar54 = fStack_104c;
    fVar55 = local_1068;
    fVar57 = fStack_1064;
    fVar58 = fStack_1060;
    fVar59 = fStack_105c;
    fVar60 = local_1078;
    fVar61 = fStack_1074;
    fVar62 = fStack_1070;
    fVar63 = fStack_106c;
  }
  if (uVar10 == 0) goto LAB_0052394e;
  uVar15 = uVar11 & 0xfffffffffffffff0;
  lVar4 = 0;
  for (uVar11 = uVar10; (uVar11 & 1) == 0; uVar11 = uVar11 >> 1 | 0x8000000000000000) {
    lVar4 = lVar4 + 1;
  }
  uVar8 = (uint)uVar10 - 1 & (uint)uVar10;
  uVar10 = (ulong)uVar8;
  uVar11 = *(ulong *)(uVar15 + lVar4 * 8);
  if (uVar8 != 0) {
    uVar2 = *(uint *)(local_10c8 + lVar4 * 4);
    lVar4 = 0;
    for (; (uVar10 & 1) == 0; uVar10 = uVar10 >> 1 | 0x8000000000000000) {
      lVar4 = lVar4 + 1;
    }
    uVar8 = uVar8 - 1 & uVar8;
    uVar12 = (ulong)uVar8;
    uVar10 = *(ulong *)(uVar15 + lVar4 * 8);
    uVar3 = *(uint *)(local_10c8 + lVar4 * 4);
    if (uVar8 == 0) {
      if (uVar2 < uVar3) {
        *(ulong *)*pauVar14 = uVar10;
        *(uint *)(*pauVar14 + 8) = uVar3;
        pauVar14 = pauVar14 + 1;
      }
      else {
        *(ulong *)*pauVar14 = uVar11;
        *(uint *)(*pauVar14 + 8) = uVar2;
        pauVar14 = pauVar14 + 1;
        uVar11 = uVar10;
      }
    }
    else {
      auVar24._8_8_ = 0;
      auVar24._0_8_ = uVar11;
      auVar23 = vpunpcklqdq_avx(auVar24,ZEXT416(uVar2));
      auVar28._8_8_ = 0;
      auVar28._0_8_ = uVar10;
      auVar32 = vpunpcklqdq_avx(auVar28,ZEXT416(uVar3));
      lVar4 = 0;
      for (; (uVar12 & 1) == 0; uVar12 = uVar12 >> 1 | 0x8000000000000000) {
        lVar4 = lVar4 + 1;
      }
      uVar8 = uVar8 - 1 & uVar8;
      uVar11 = (ulong)uVar8;
      auVar31._8_8_ = 0;
      auVar31._0_8_ = *(ulong *)(uVar15 + lVar4 * 8);
      auVar34 = vpunpcklqdq_avx(auVar31,ZEXT416(*(uint *)(local_10c8 + lVar4 * 4)));
      auVar22 = vpcmpgtd_avx(auVar32,auVar23);
      if (uVar8 == 0) {
        auVar20 = vpshufd_avx(auVar22,0xaa);
        auVar22 = vblendvps_avx(auVar32,auVar23,auVar20);
        auVar23 = vblendvps_avx(auVar23,auVar32,auVar20);
        auVar32 = vpcmpgtd_avx(auVar34,auVar22);
        auVar20 = vpshufd_avx(auVar32,0xaa);
        auVar32 = vblendvps_avx(auVar34,auVar22,auVar20);
        auVar22 = vblendvps_avx(auVar22,auVar34,auVar20);
        auVar34 = vpcmpgtd_avx(auVar22,auVar23);
        auVar20 = vpshufd_avx(auVar34,0xaa);
        auVar34 = vblendvps_avx(auVar22,auVar23,auVar20);
        auVar23 = vblendvps_avx(auVar23,auVar22,auVar20);
        *pauVar14 = auVar23;
        pauVar14[1] = auVar34;
        uVar11 = auVar32._0_8_;
        pauVar14 = pauVar14 + 2;
      }
      else {
        lVar4 = 0;
        for (; (uVar11 & 1) == 0; uVar11 = uVar11 >> 1 | 0x8000000000000000) {
          lVar4 = lVar4 + 1;
        }
        auVar36._8_8_ = 0;
        auVar36._0_8_ = *(ulong *)(uVar15 + lVar4 * 8);
        auVar40 = vpunpcklqdq_avx(auVar36,ZEXT416(*(uint *)(local_10c8 + lVar4 * 4)));
        auVar20 = vpshufd_avx(auVar22,0xaa);
        auVar22 = vblendvps_avx(auVar32,auVar23,auVar20);
        auVar23 = vblendvps_avx(auVar23,auVar32,auVar20);
        auVar32 = vpcmpgtd_avx(auVar40,auVar34);
        auVar20 = vpshufd_avx(auVar32,0xaa);
        auVar32 = vblendvps_avx(auVar40,auVar34,auVar20);
        auVar34 = vblendvps_avx(auVar34,auVar40,auVar20);
        auVar20 = vpcmpgtd_avx(auVar34,auVar23);
        auVar40 = vpshufd_avx(auVar20,0xaa);
        auVar20 = vblendvps_avx(auVar34,auVar23,auVar40);
        auVar23 = vblendvps_avx(auVar23,auVar34,auVar40);
        auVar34 = vpcmpgtd_avx(auVar32,auVar22);
        auVar40 = vpshufd_avx(auVar34,0xaa);
        auVar34 = vblendvps_avx(auVar32,auVar22,auVar40);
        auVar32 = vblendvps_avx(auVar22,auVar32,auVar40);
        auVar22 = vpcmpgtd_avx(auVar20,auVar32);
        auVar40 = vpshufd_avx(auVar22,0xaa);
        auVar22 = vblendvps_avx(auVar20,auVar32,auVar40);
        auVar32 = vblendvps_avx(auVar32,auVar20,auVar40);
        *pauVar14 = auVar23;
        pauVar14[1] = auVar32;
        pauVar14[2] = auVar22;
        auVar39 = ZEXT1664(local_10b8);
        uVar11 = auVar34._0_8_;
        pauVar14 = pauVar14 + 3;
      }
    }
  }
  goto LAB_005233fb;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }